

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.h
# Opt level: O0

long gimage::cmp<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *diff,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *im1,
               Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *im2,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *tol)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  work_t wVar4;
  work_t wVar5;
  long lVar6;
  long lVar7;
  size_type sVar8;
  byte *pbVar9;
  long lVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  work_t v;
  work_t v2;
  work_t v1;
  long i;
  long k;
  int d;
  work_t t;
  long ret;
  work_t in_stack_ffffffffffffff58;
  work_t in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar11;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  long in_stack_ffffffffffffffb8;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *i_00;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_ffffffffffffffc0;
  int local_38;
  uint local_34;
  long local_30;
  
  lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RSI);
  lVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RDX);
  if (lVar6 == lVar7) {
    lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RSI);
    lVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RDX);
    if (lVar6 == lVar7) {
      iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RSI);
      iVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RDX);
      if (iVar2 == iVar3) {
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(in_RSI);
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(in_RSI);
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RSI);
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        local_30 = 0;
        local_34 = 0;
        local_38 = 0;
        while (iVar2 = local_38,
              iVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(in_RSI),
              iVar2 < iVar3) {
          iVar3 = local_38;
          sVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RCX);
          if (iVar3 < (int)sVar8) {
            pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (in_RCX,(long)local_38);
            local_34 = (uint)*pbVar9;
          }
          lVar6 = 0;
          while (lVar7 = lVar6,
                lVar10 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight
                                   (in_RSI), lVar6 < lVar10) {
            this = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)0x0;
            while (i_00 = this,
                  lVar10 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                                     (in_RSI), (long)this < lVar10) {
              wVar4 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getW
                                (in_RSI,(long)i_00,lVar7,local_38);
              wVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getW
                                (in_RDX,(long)i_00,lVar7,local_38);
              bVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValidW
                                (this,in_stack_ffffffffffffff5c);
              if ((bVar1) &&
                 (bVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValidW
                                    (this,in_stack_ffffffffffffff5c), bVar1)) {
                iVar11 = wVar4 - wVar5;
              }
              else {
                bVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValidW
                                  (this,in_stack_ffffffffffffff5c);
                if ((bVar1) ||
                   (bVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValidW
                                      (this,in_stack_ffffffffffffff5c), bVar1)) {
                  iVar11 = PixelTraits<unsigned_char>::invalid();
                }
                else {
                  iVar11 = 0;
                }
              }
              if ((int)local_34 < iVar11) {
                local_30 = local_30 + 1;
              }
              Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setLimited
                        ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                         CONCAT44(iVar2,iVar3),lVar6,(long)this,in_stack_ffffffffffffff5c,
                         in_stack_ffffffffffffff58);
              this = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                     ((long)&i_00->depth + 1);
            }
            lVar6 = lVar7 + 1;
          }
          local_38 = local_38 + 1;
        }
        return local_30;
      }
    }
  }
  return -1;
}

Assistant:

long cmp(Image<T> &diff, const Image<T> &im1,
                           const Image<T> &im2, const std::vector<T> &tol)
{
  if (im1.getWidth() != im2.getWidth() || im1.getHeight() != im2.getHeight() ||
      im1.getDepth() != im2.getDepth())
  {
    return -1;
  }

  diff.setSize(im1.getWidth(), im1.getHeight(), im1.getDepth());

  long ret=0;
  typename Image<T>::work_t t=0;

  for (int d=0; d<im1.getDepth(); d++)
  {
    if (d < static_cast<int>(tol.size()))
    {
      t=tol[d];
    }

    for (long k=0; k<im1.getHeight(); k++)
    {
      for (long i=0; i<im1.getWidth(); i++)
      {
        typename Image<T>::work_t v1=im1.getW(i, k, d);
        typename Image<T>::work_t v2=im2.getW(i, k, d);
        typename Image<T>::work_t v;

        if (im1.isValidW(v1) && im2.isValidW(v2))
        {
          v=v1-v2;
        }
        else if (!im1.isValidW(v1) && !im2.isValidW(v2))
        {
          v=0;
        }
        else
        {
          v=Image<T>::ptraits::invalid();
        }

//        if (v < 0)
//        {
//          v=-v;
//        }

        if (v > t)
        {
          ret++;
        }

        diff.setLimited(i, k, d, v);
      }
    }
  }

  return ret;
}